

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall jsonnet::internal::LiteralNumber::~LiteralNumber(LiteralNumber *this)

{
  AST *in_RDI;
  
  in_RDI->_vptr_AST = (_func_int **)&PTR__LiteralNumber_003a3e00;
  std::__cxx11::string::~string((string *)&in_RDI[1].location);
  AST::~AST(in_RDI);
  return;
}

Assistant:

LiteralNumber(const LocationRange &lr, const Fodder &open_fodder, const std::string &str)
        : AST(lr, AST_LITERAL_NUMBER, open_fodder),
          value(strtod(str.c_str(), nullptr)),
          originalString(str)
    {
    }